

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluFboRenderContext.cpp
# Opt level: O3

void __thiscall
glu::FboRenderContext::FboRenderContext
          (FboRenderContext *this,ContextFactory *factory,RenderConfig *config,CommandLine *cmdLine)

{
  int iVar1;
  undefined4 extraout_var;
  ApiType local_68;
  undefined8 local_64;
  undefined4 local_5c;
  Visibility local_58;
  undefined4 local_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 local_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 local_34;
  
  (this->super_RenderContext)._vptr_RenderContext = (_func_int **)&PTR__FboRenderContext_002738e8;
  this->m_context = (RenderContext *)0x0;
  this->m_framebuffer = 0;
  this->m_colorBuffer = 0;
  this->m_depthStencilBuffer = 0;
  tcu::RenderTarget::RenderTarget(&this->m_renderTarget);
  local_64 = 0xffffffffffffffff;
  local_5c = 0;
  local_54 = 0xffffffff;
  uStack_50 = 0xffffffff;
  uStack_4c = 0xffffffff;
  uStack_48 = 0xffffffff;
  local_44 = 0xffffffff;
  uStack_40 = 0xffffffff;
  uStack_3c = 0xffffffff;
  uStack_38 = 0xffffffff;
  local_34 = 0;
  local_68.m_bits = (config->type).super_ApiType.m_bits;
  local_58 = config->windowVisibility;
  iVar1 = (*(factory->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[3])
                    (factory,&local_68,cmdLine);
  this->m_context = (RenderContext *)CONCAT44(extraout_var,iVar1);
  createFramebuffer(this,config);
  return;
}

Assistant:

FboRenderContext::FboRenderContext (const ContextFactory& factory, const RenderConfig& config, const tcu::CommandLine& cmdLine)
	: m_context				(DE_NULL)
	, m_framebuffer			(0)
	, m_colorBuffer			(0)
	, m_depthStencilBuffer	(0)
	, m_renderTarget		()
{
	try
	{
		RenderConfig nativeRenderConfig;
		nativeRenderConfig.type				= config.type;
		nativeRenderConfig.windowVisibility	= config.windowVisibility;
		// \note All other properties are defaults, mostly DONT_CARE
		m_context = factory.createContext(nativeRenderConfig, cmdLine);
		createFramebuffer(config);
	}
	catch (...)
	{
		delete m_context;
		throw;
	}
}